

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O2

void BZ2_blockSort(EState *s)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  uint nblock;
  int verb;
  UInt32 UVar4;
  UInt32 *pUVar5;
  byte *block;
  bool bVar6;
  Bool BVar7;
  Int32 yyn_1;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  UInt32 UVar13;
  uint *puVar14;
  ulong uVar15;
  char cVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  Int32 *pIVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  ushort uVar26;
  long lVar27;
  byte bVar28;
  UInt16 UVar29;
  int iVar30;
  UInt32 *pUVar31;
  Int32 yyn;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  int iVar39;
  UInt32 *bhtab;
  Int32 zztmp;
  int iVar40;
  Int32 budget;
  ulong local_12a8;
  ulong local_12a0;
  UInt16 *local_1298;
  ulong local_1290;
  long local_1288;
  long local_1280;
  ulong local_1278;
  ulong local_1270;
  int local_1264;
  ulong local_1260;
  long local_1258;
  long local_1250;
  ulong local_1248;
  long local_1240;
  UInt32 *local_1238;
  int local_1230;
  uint local_122c;
  int local_1228;
  int local_1224;
  int local_1220;
  int local_121c;
  ulong local_1218;
  ulong local_1210;
  ulong local_1208;
  ulong local_1200;
  UInt32 *local_11f8;
  EState *local_11f0;
  Bool bigDone [256];
  int local_10e8 [100];
  Int32 stackHi [100];
  Int32 stackLo [100];
  Int32 runningOrder [256];
  int aiStack_838 [256];
  Int32 copyStart [256];
  
  bhtab = s->ftab;
  pUVar5 = s->ptr;
  nblock = s->nblock;
  uVar18 = (ulong)nblock;
  verb = s->verbosity;
  if (9999 < (int)nblock) {
    block = s->block;
    iVar11 = s->workFactor;
    uVar15 = (ulong)(nblock + (nblock & 1) + 0x22);
    if (iVar11 < 2) {
      iVar11 = 1;
    }
    cVar16 = 'd';
    if (iVar11 < 100) {
      cVar16 = (char)iVar11;
    }
    budget = ((byte)(cVar16 - 1U) / 3) * nblock;
    local_1264 = budget;
    local_11f0 = s;
    if (3 < verb) {
      fwrite("        main sort initialise ...\n",0x21,1,_stderr);
    }
    local_1298 = (UInt16 *)(block + uVar15);
    for (uVar8 = 0x10000; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      bhtab[uVar8] = 0;
    }
    uVar34 = (ulong)*block << 8;
    local_1230 = nblock - 1;
    uVar8 = nblock;
    while( true ) {
      uVar9 = uVar8 - 4;
      uVar22 = uVar8 - 1;
      if ((int)uVar22 < 3) break;
      local_1298[uVar22] = 0;
      bVar17 = block[uVar22];
      bhtab[(uint)bVar17 << 8 | (uint)(uVar34 >> 8)] =
           bhtab[(uint)bVar17 << 8 | (uint)(uVar34 >> 8)] + 1;
      local_1298[uVar8 - 2] = 0;
      bVar28 = block[uVar8 - 2];
      bhtab[CONCAT11(bVar28,bVar17)] = bhtab[CONCAT11(bVar28,bVar17)] + 1;
      local_1298[uVar8 - 3] = 0;
      bVar17 = block[uVar8 - 3];
      piVar1 = (int *)((long)bhtab + (ulong)((uint)bVar17 * 0x400 + (uint)bVar28 * 4));
      *piVar1 = *piVar1 + 1;
      local_1298[uVar9] = 0;
      uVar34 = (ulong)CONCAT11(block[uVar9],bVar17);
      bhtab[uVar34] = bhtab[uVar34] + 1;
      uVar8 = uVar9;
    }
    for (; -1 < (int)uVar22; uVar22 = uVar22 - 1) {
      local_1298[uVar22] = 0;
      uVar8 = (uint)block[uVar22] << 8 | (uint)(uVar34 >> 8);
      bhtab[uVar8] = bhtab[uVar8] + 1;
      uVar34 = (ulong)uVar8;
    }
    for (lVar24 = 0; lVar24 != 0x22; lVar24 = lVar24 + 1) {
      block[lVar24 + uVar18] = block[lVar24];
      (block + lVar24 * 2 + uVar15 + uVar18 * 2)[0] = 0;
      (block + lVar24 * 2 + uVar15 + uVar18 * 2)[1] = 0;
    }
    if (3 < verb) {
      fwrite("        bucket sorting ...\n",0x1b,1,_stderr);
    }
    for (lVar24 = 0; lVar24 != 0x10000; lVar24 = lVar24 + 1) {
      bhtab[lVar24 + 1] = bhtab[lVar24 + 1] + bhtab[lVar24];
    }
    uVar26 = (ushort)*block << 8;
    uVar8 = nblock;
    while( true ) {
      uVar9 = uVar8 - 4;
      uVar22 = uVar8 - 1;
      if ((int)uVar22 < 3) break;
      bVar17 = block[uVar22];
      uVar26 = (ushort)bVar17 << 8 | uVar26 >> 8;
      UVar13 = bhtab[uVar26];
      bhtab[uVar26] = UVar13 - 1;
      pUVar5[(int)(UVar13 - 1)] = uVar22;
      bVar28 = block[uVar8 - 2];
      uVar26 = CONCAT11(bVar28,bVar17);
      UVar13 = bhtab[uVar26];
      bhtab[uVar26] = UVar13 - 1;
      pUVar5[(int)(UVar13 - 1)] = uVar8 - 2;
      bVar17 = block[uVar8 - 3];
      uVar26 = CONCAT11(bVar17,bVar28);
      UVar13 = bhtab[uVar26];
      bhtab[uVar26] = UVar13 - 1;
      pUVar5[(int)(UVar13 - 1)] = uVar8 - 3;
      uVar26 = CONCAT11(block[uVar9],bVar17);
      UVar13 = bhtab[uVar26];
      bhtab[uVar26] = UVar13 - 1;
      pUVar5[(int)(UVar13 - 1)] = uVar9;
      uVar8 = uVar9;
    }
    for (; -1 < (int)uVar22; uVar22 = uVar22 - 1) {
      uVar26 = uVar26 >> 8 | (ushort)block[uVar22] << 8;
      UVar13 = bhtab[uVar26];
      bhtab[uVar26] = UVar13 - 1;
      pUVar5[(int)(UVar13 - 1)] = uVar22;
    }
    for (lVar24 = 0; lVar24 != 0x100; lVar24 = lVar24 + 1) {
      bigDone[lVar24] = '\0';
      runningOrder[lVar24] = (Int32)lVar24;
    }
    iVar11 = 0x16c;
    do {
      iVar10 = iVar11 / 3;
      iVar30 = 0;
      for (lVar24 = (long)iVar10; lVar24 < 0x100; lVar24 = lVar24 + 1) {
        iVar39 = runningOrder[lVar24];
        iVar36 = iVar39 * 0x100;
        UVar13 = bhtab[iVar36 + 0x100];
        UVar4 = bhtab[iVar36];
        iVar36 = iVar30;
        do {
          iVar40 = runningOrder[iVar36] * 0x100;
          lVar27 = (long)(iVar10 + iVar36);
          if (bhtab[iVar40 + 0x100] - bhtab[iVar40] <= UVar13 - UVar4) break;
          runningOrder[iVar10 + iVar36] = runningOrder[iVar36];
          bVar6 = iVar10 <= iVar36;
          lVar27 = (long)iVar36;
          iVar36 = iVar36 - iVar10;
        } while (bVar6);
        runningOrder[lVar27] = iVar39;
        iVar30 = iVar30 + 1;
      }
      uVar8 = iVar11 - 3;
      iVar11 = iVar10;
    } while (2 < uVar8);
    local_11f8 = bhtab + 1;
    local_1260 = 0;
    lVar24 = 0;
    iVar11 = local_1264;
    local_1238 = bhtab;
    while (lVar24 != 0x100) {
      uVar15 = (ulong)(uint)runningOrder[lVar24];
      local_1228 = runningOrder[lVar24] << 8;
      local_1248 = (ulong)local_1228;
      local_1250 = lVar24;
      for (uVar34 = 0; uVar34 != 0x100; uVar34 = uVar34 + 1) {
        if (uVar34 != uVar15) {
          uVar19 = uVar34 | local_1248;
          UVar13 = bhtab[uVar19];
          if ((UVar13 >> 0x15 & 1) == 0) {
            uVar8 = (bhtab[uVar19 + 1] & 0xffdfffff) - 1;
            local_1208 = (ulong)uVar8;
            local_1200 = uVar19;
            if ((int)UVar13 < (int)uVar8) {
              local_1218 = uVar34;
              local_1210 = uVar15;
              if (3 < verb) {
                fprintf(_stderr,"        qsort [0x%x, 0x%x]   done %d   this %d\n",uVar15,uVar34,
                        local_1260,(ulong)((bhtab[uVar19 + 1] & 0xffdfffff) - UVar13));
              }
              stackLo[0] = UVar13;
              stackHi[0] = (Int32)local_1208;
              local_10e8[0] = 2;
              local_1270 = 1;
              local_122c = UVar13;
LAB_003a16a4:
              uVar15 = local_1270 & 0xffffffff;
              local_12a8 = CONCAT44(local_12a8._4_4_,iVar11);
LAB_003a16af:
              if (0 < (int)uVar15) {
                local_1270 = (ulong)((int)uVar15 - 1);
                local_1278 = uVar15;
LAB_003a16c4:
                if (0x61 < (uint)local_1278) {
                  BZ2_bz__AssertH__fail(0x3e9);
                }
                uVar8 = stackLo[local_1270];
                local_1290 = (ulong)uVar8;
                uVar22 = stackHi[local_1270];
                lVar24 = (long)(int)uVar22;
                iVar10 = local_10e8[local_1270];
                iVar11 = uVar22 - uVar8;
                if ((0x13 < iVar11) && (iVar10 < 0xf)) {
                  local_1258 = (long)(int)uVar8;
                  bVar17 = block[pUVar5[local_1258] + iVar10];
                  bVar28 = block[pUVar5[lVar24] + iVar10];
                  bVar21 = bVar28;
                  if (bVar17 >= bVar28 && bVar17 != bVar28) {
                    bVar21 = bVar17;
                  }
                  bVar3 = block[pUVar5[(int)(uVar22 + uVar8) >> 1] + iVar10];
                  if (bVar17 < bVar28) {
                    bVar28 = bVar17;
                  }
                  if (bVar28 <= bVar3) {
                    bVar28 = bVar3;
                  }
                  local_12a0 = local_1290;
                  uVar9 = uVar22;
                  uVar37 = uVar22;
                  uVar32 = uVar8;
                  if (bVar21 <= bVar3) {
                    bVar28 = bVar21;
                  }
LAB_003a1776:
                  lVar24 = (long)(int)uVar37 + 1;
                  iVar11 = (int)local_12a0;
                  local_12a0 = (ulong)iVar11;
                  local_1288 = CONCAT44(local_1288._4_4_,iVar11 - uVar8);
                  local_1280 = CONCAT44(local_1280._4_4_,-iVar11);
LAB_003a1798:
                  lVar25 = (long)(int)uVar32;
                  lVar27 = lVar25;
                  do {
                    uVar32 = uVar32 + 1;
                    if ((int)uVar37 < lVar27) {
                      lVar27 = lVar25;
                      if (lVar25 < lVar24) {
                        lVar27 = lVar24;
                      }
LAB_003a17f0:
                      iVar30 = (int)lVar27;
                      lVar24 = (long)iVar30;
                      lVar27 = (long)(int)uVar9;
                      iVar11 = uVar22 - uVar9;
                      goto LAB_003a1803;
                    }
                    UVar13 = pUVar5[lVar27];
                    bVar17 = block[UVar13 + iVar10];
                    if (bVar17 == bVar28) goto LAB_003a17c0;
                    if (bVar28 <= bVar17 && bVar17 != bVar28) goto LAB_003a17f0;
                    lVar27 = lVar27 + 1;
                  } while( true );
                }
                if (iVar11 < 1) goto LAB_003a1d19;
                lVar27 = -1;
                pIVar20 = incs;
                do {
                  lVar27 = lVar27 + 1;
                  iVar30 = *pIVar20;
                  pIVar20 = pIVar20 + 1;
                } while (iVar30 <= iVar11);
                local_1220 = uVar8 + 1;
                local_1224 = uVar8 + 2;
                uVar15 = local_1290;
                local_1288 = lVar24;
                do {
                  if (lVar27 < 1) {
                    local_12a8 = CONCAT44(local_12a8._4_4_,budget);
                    goto LAB_003a1d19;
                  }
                  iVar30 = *(int *)("        %d pointers, %d sorted, %d scanned\n" +
                                   lVar27 * 4 + 0x29);
                  local_1240 = lVar27 + -1;
                  iVar11 = iVar30 + (int)uVar15;
                  local_12a0 = CONCAT44(local_12a0._4_4_,iVar11);
                  lVar25 = (long)iVar11;
                  local_1278 = CONCAT44(local_1278._4_4_,local_1224);
                  local_1258 = CONCAT44(local_1258._4_4_,local_1220);
                  uVar34 = uVar15 & 0xffffffff;
                  while (lVar27 = local_1240, lVar25 <= lVar24) {
                    uVar8 = pUVar5[lVar25];
                    local_12a8 = (ulong)uVar8;
                    local_121c = (int)uVar34;
                    local_1280 = lVar25;
                    do {
                      iVar11 = (int)uVar34;
                      UVar13 = pUVar5[iVar11];
                      BVar7 = mainGtU(UVar13 + iVar10,uVar8 + iVar10,block,local_1298,nblock,&budget
                                     );
                      lVar24 = (long)(iVar30 + iVar11);
                      if (BVar7 == '\0') break;
                      pUVar5[iVar30 + iVar11] = UVar13;
                      uVar34 = (ulong)(uint)(iVar11 - iVar30);
                      lVar24 = (long)iVar11;
                    } while ((int)local_12a0 <= iVar11);
                    pUVar5[lVar24] = (UInt32)local_12a8;
                    lVar24 = local_1288;
                    lVar27 = local_1240;
                    uVar15 = local_1290;
                    bhtab = local_1238;
                    if (local_1288 <= local_1280) break;
                    uVar8 = pUVar5[local_1280 + 1];
                    local_12a8 = (ulong)uVar8;
                    iVar11 = (int)local_1258;
                    do {
                      UVar13 = pUVar5[iVar11];
                      BVar7 = mainGtU(UVar13 + iVar10,iVar10 + uVar8,block,local_1298,nblock,&budget
                                     );
                      lVar24 = (long)(iVar30 + iVar11);
                      if (BVar7 == '\0') break;
                      pUVar5[iVar30 + iVar11] = UVar13;
                      bVar6 = (int)local_12a0 <= iVar11;
                      lVar24 = (long)iVar11;
                      iVar11 = iVar11 - iVar30;
                    } while (bVar6);
                    pUVar5[lVar24] = (UInt32)local_12a8;
                    lVar24 = local_1288;
                    lVar27 = local_1240;
                    uVar15 = local_1290;
                    bhtab = local_1238;
                    if (local_1288 < local_1280 + 2) break;
                    uVar8 = pUVar5[local_1280 + 2];
                    local_12a8 = (ulong)uVar8;
                    iVar11 = (int)local_1278;
                    do {
                      UVar13 = pUVar5[iVar11];
                      BVar7 = mainGtU(UVar13 + iVar10,iVar10 + uVar8,block,local_1298,nblock,&budget
                                     );
                      lVar24 = (long)(iVar30 + iVar11);
                      if (BVar7 == '\0') break;
                      pUVar5[iVar30 + iVar11] = UVar13;
                      bVar6 = (int)local_12a0 <= iVar11;
                      lVar24 = (long)iVar11;
                      iVar11 = iVar11 - iVar30;
                    } while (bVar6);
                    pUVar5[lVar24] = (UInt32)local_12a8;
                    lVar25 = local_1280 + 3;
                    uVar34 = (ulong)(local_121c + 3);
                    local_1258 = CONCAT44(local_1258._4_4_,(int)local_1258 + 3);
                    local_1278 = CONCAT44(local_1278._4_4_,(int)local_1278 + 3);
                    lVar24 = local_1288;
                    uVar15 = local_1290;
                    bhtab = local_1238;
                    iVar11 = budget;
                    if (budget < 0) goto LAB_003a2053;
                  }
                } while( true );
              }
              if (iVar11 < 0) goto LAB_003a2053;
              local_1260 = (ulong)(((int)local_1260 - local_122c) + (int)local_1208 + 1);
              UVar13 = bhtab[local_1200];
              uVar19 = local_1200;
              uVar15 = local_1210;
              uVar34 = local_1218;
            }
          }
          bhtab[uVar19] = UVar13 | 0x200000;
        }
      }
      lVar24 = (long)(int)uVar15;
      if (bigDone[lVar24] != '\0') {
        BZ2_bz__AssertH__fail(0x3ee);
      }
      puVar14 = local_11f8 + lVar24;
      for (lVar27 = 0; lVar27 != 0x100; lVar27 = lVar27 + 1) {
        copyStart[lVar27] = puVar14[-1] & 0xffdfffff;
        aiStack_838[lVar27] = (*puVar14 & 0xffdfffff) - 1;
        puVar14 = puVar14 + 0x100;
      }
      for (uVar15 = (long)(int)bhtab[local_1248] & 0xffffffffffdfffff; iVar10 = copyStart[lVar24],
          (long)uVar15 < (long)iVar10; uVar15 = uVar15 + 1) {
        UVar13 = (pUVar5[uVar15] + ((int)(pUVar5[uVar15] - 1) >> 0x1f & nblock)) - 1;
        bVar17 = block[(int)UVar13];
        if (bigDone[bVar17] == '\0') {
          iVar10 = copyStart[bVar17];
          copyStart[bVar17] = iVar10 + 1;
          pUVar5[iVar10] = UVar13;
        }
      }
      iVar30 = local_1228 + 0x100;
      uVar8 = bhtab[iVar30] & 0xffdfffff;
      while( true ) {
        uVar8 = uVar8 - 1;
        iVar39 = aiStack_838[lVar24];
        if ((int)uVar8 <= iVar39) break;
        UVar13 = (pUVar5[(int)uVar8] + ((int)(pUVar5[(int)uVar8] - 1) >> 0x1f & nblock)) - 1;
        bVar17 = block[(int)UVar13];
        if (bigDone[bVar17] == '\0') {
          iVar39 = aiStack_838[bVar17];
          aiStack_838[bVar17] = iVar39 + -1;
          pUVar5[iVar39] = UVar13;
        }
      }
      if ((iVar10 + -1 != iVar39) && ((iVar10 != 0 || (iVar39 != local_1230)))) {
        BZ2_bz__AssertH__fail(0x3ef);
      }
      for (lVar27 = 0; lVar27 != 0x40000; lVar27 = lVar27 + 0x400) {
        pbVar2 = (byte *)((long)bhtab + lVar27 + lVar24 * 4 + 2);
        *pbVar2 = *pbVar2 | 0x20;
      }
      bigDone[lVar24] = '\x01';
      if (local_1250 != 0xff) {
        UVar13 = bhtab[local_1248];
        iVar10 = (bhtab[iVar30] & 0xffdfffff) - (int)((long)(int)UVar13 & 0xffffffffffdfffffU);
        bVar17 = 0xff;
        do {
          bVar17 = bVar17 + 1;
        } while (0xfffe < iVar10 >> (bVar17 & 0x1f));
        iVar10 = iVar10 + -1;
        for (lVar24 = (long)iVar10; -1 < lVar24; lVar24 = lVar24 + -1) {
          UVar4 = pUVar5[((long)(int)UVar13 & 0xffffffffffdfffffU) + lVar24];
          UVar29 = (UInt16)((uint)lVar24 >> (bVar17 & 0x1f));
          local_1298[(int)UVar4] = UVar29;
          if ((long)(int)UVar4 < 0x22) {
            local_1298[(int)(UVar4 + nblock)] = UVar29;
          }
        }
        if (0xffff < iVar10 >> (bVar17 & 0x1f)) {
          BZ2_bz__AssertH__fail(0x3ea);
        }
      }
      lVar24 = local_1250 + 1;
    }
    if (verb < 4) {
LAB_003a2053:
      if (2 < verb) goto LAB_003a2126;
    }
    else {
      fprintf(_stderr,"        %d pointers, %d sorted, %d scanned\n",uVar18,local_1260,
              (ulong)(nblock - (int)local_1260));
LAB_003a2126:
      fprintf(_stderr,"      %d work, %d block, ratio %5.2f\n",
              (double)((float)(local_1264 - iVar11) / (float)(int)nblock));
    }
    s = local_11f0;
    if (-1 < iVar11) goto LAB_003a2085;
    if (1 < verb) {
      fwrite("    too repetitive; using fallback sorting algorithm\n",0x35,1,_stderr);
    }
  }
  fallbackSort(s->arr1,s->arr2,bhtab,nblock,verb);
LAB_003a2085:
  s->origPtr = -1;
  uVar15 = 0;
  uVar18 = (ulong)(uint)s->nblock;
  if (s->nblock < 1) {
    uVar18 = uVar15;
  }
  while( true ) {
    if (uVar18 == uVar15) {
      BZ2_bz__AssertH__fail(0x3eb);
      return;
    }
    if (pUVar5[uVar15] == 0) break;
    uVar15 = uVar15 + 1;
  }
  s->origPtr = (Int32)uVar15;
  return;
LAB_003a17c0:
  pUVar5[lVar27] = pUVar5[local_12a0];
  pUVar5[local_12a0] = UVar13;
  local_12a0 = local_12a0 + 1;
  local_1288 = CONCAT44(local_1288._4_4_,(int)local_1288 + 1);
  local_1280 = CONCAT44(local_1280._4_4_,(int)local_1280 + -1);
  goto LAB_003a1798;
LAB_003a1803:
  iVar39 = uVar9 - uVar37;
  uVar32 = -uVar37;
  lVar38 = (long)(int)uVar37;
  for (lVar25 = lVar38; uVar37 = (uint)lVar27, lVar24 <= lVar25; lVar25 = lVar25 + -1) {
    UVar13 = pUVar5[lVar25];
    if (block[iVar10 + UVar13] == bVar28) goto LAB_003a183d;
    if (block[iVar10 + UVar13] < bVar28) {
      UVar4 = pUVar5[lVar24];
      pUVar5[lVar24] = UVar13;
      pUVar5[lVar25] = UVar4;
      uVar9 = uVar37;
      uVar37 = ~uVar32;
      uVar32 = iVar30 + 1;
      goto LAB_003a1776;
    }
    uVar32 = uVar32 + 1;
    iVar39 = iVar39 + 1;
  }
  if (lVar27 < (long)local_12a0) {
    local_10e8[local_1270] = iVar10 + 1;
    goto LAB_003a16c4;
  }
  iVar40 = (int)local_12a0;
  iVar36 = iVar30 - iVar40;
  if ((int)(iVar40 - uVar8) < iVar30 - iVar40) {
    iVar36 = iVar40 - uVar8;
  }
  iVar35 = (int)local_1280 + iVar30;
  if ((int)local_1288 < (int)local_1280 + iVar30) {
    iVar35 = (int)local_1288;
  }
  pUVar31 = pUVar5;
  for (; 0 < iVar36; iVar36 = iVar36 + -1) {
    UVar13 = pUVar31[local_1258];
    pUVar31[local_1258] = pUVar31[iVar30 - iVar35];
    pUVar31[iVar30 - iVar35] = UVar13;
    pUVar31 = pUVar31 + 1;
  }
  if (lVar24 + -1 < lVar38) {
    lVar38 = lVar24 + -1;
  }
  iVar35 = uVar37 - (int)lVar38;
  iVar36 = uVar22 - uVar37;
  if (iVar35 <= (int)(uVar22 - uVar37)) {
    iVar36 = iVar35;
  }
  if (iVar11 < iVar39) {
    iVar39 = iVar11;
  }
  pUVar31 = pUVar5;
  for (; 0 < iVar36; iVar36 = iVar36 + -1) {
    UVar13 = pUVar31[iVar30];
    pUVar31[iVar30] = pUVar31[(long)(int)(uVar22 - iVar39) + 1];
    pUVar31[(long)(int)(uVar22 - iVar39) + 1] = UVar13;
    pUVar31 = pUVar31 + 1;
  }
  uVar37 = ((uVar8 - iVar40) + iVar30) - 1;
  uVar12 = uVar22 - iVar35;
  uVar9 = uVar12 + 1;
  iVar11 = uVar22 - uVar9;
  uVar32 = uVar22;
  uVar23 = uVar8;
  if ((int)(uVar37 - uVar8) < iVar11) {
    iVar11 = uVar37 - uVar8;
    uVar32 = uVar37;
    uVar23 = uVar9;
    uVar9 = uVar8;
    uVar37 = uVar22;
  }
  uVar33 = (uVar8 - iVar40) + iVar30;
  iVar39 = iVar10 + 1;
  uVar8 = uVar32;
  iVar30 = iVar10;
  uVar22 = uVar9;
  if (iVar11 < (int)(uVar12 - uVar33)) {
    uVar8 = uVar12;
    iVar30 = iVar39;
    iVar11 = uVar12 - uVar33;
    uVar22 = uVar33;
    uVar33 = uVar9;
    uVar12 = uVar32;
    iVar39 = iVar10;
  }
  uVar9 = uVar37;
  iVar36 = iVar10;
  uVar32 = uVar23;
  if ((int)(uVar37 - uVar23) < iVar11) {
    uVar9 = uVar8;
    iVar36 = iVar30;
    uVar32 = uVar22;
    uVar22 = uVar23;
    uVar8 = uVar37;
    iVar30 = iVar10;
  }
  stackLo[local_1270] = uVar32;
  stackHi[local_1270] = uVar9;
  local_10e8[local_1270] = iVar36;
  uVar15 = local_1278 & 0xffffffff;
  stackLo[uVar15] = uVar22;
  stackHi[uVar15] = uVar8;
  local_10e8[uVar15] = iVar30;
  stackLo[uVar15 + 1] = uVar33;
  stackHi[uVar15 + 1] = uVar12;
  stackHi[uVar15 - 99] = iVar39;
  uVar15 = (ulong)((int)local_1278 + 2);
  iVar11 = (int)local_12a8;
  goto LAB_003a16af;
LAB_003a183d:
  pUVar5[lVar25] = pUVar5[lVar27];
  pUVar5[lVar27] = UVar13;
  lVar27 = lVar27 + -1;
  uVar37 = ~uVar32;
  iVar11 = iVar11 + 1;
  uVar9 = uVar9 - 1;
  goto LAB_003a1803;
LAB_003a1d19:
  iVar11 = (int)local_12a8;
  if ((int)local_12a8 < 0) goto LAB_003a2053;
  goto LAB_003a16a4;
}

Assistant:

void BZ2_blockSort ( EState* s )
{
   UInt32* ptr    = s->ptr; 
   UChar*  block  = s->block;
   UInt32* ftab   = s->ftab;
   Int32   nblock = s->nblock;
   Int32   verb   = s->verbosity;
   Int32   wfact  = s->workFactor;
   UInt16* quadrant;
   Int32   budget;
   Int32   budgetInit;
   Int32   i;

   if (nblock < 10000) {
      fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
   } else {
      /* Calculate the location for quadrant, remembering to get
         the alignment right.  Assumes that &(block[0]) is at least
         2-byte aligned -- this should be ok since block is really
         the first section of arr2.
      */
      i = nblock+BZ_N_OVERSHOOT;
      if (i & 1) i++;
      quadrant = (UInt16*)(&(block[i]));

      /* (wfact-1) / 3 puts the default-factor-30
         transition point at very roughly the same place as 
         with v0.1 and v0.9.0.  
         Not that it particularly matters any more, since the
         resulting compressed stream is now the same regardless
         of whether or not we use the main sort or fallback sort.
      */
      if (wfact < 1  ) wfact = 1;
      if (wfact > 100) wfact = 100;
      budgetInit = nblock * ((wfact-1) / 3);
      budget = budgetInit;

      mainSort ( ptr, block, quadrant, ftab, nblock, verb, &budget );
      if (verb >= 3) 
         VPrintf3 ( "      %d work, %d block, ratio %5.2f\n",
                    budgetInit - budget,
                    nblock, 
                    (float)(budgetInit - budget) /
                    (float)(nblock==0 ? 1 : nblock) ); 
      if (budget < 0) {
         if (verb >= 2) 
            VPrintf0 ( "    too repetitive; using fallback"
                       " sorting algorithm\n" );
         fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
      }
   }

   s->origPtr = -1;
   for (i = 0; i < s->nblock; i++)
      if (ptr[i] == 0)
         { s->origPtr = i; break; };

   AssertH( s->origPtr != -1, 1003 );
}